

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesAttGroupInfo::addAnyAttDef
          (XercesAttGroupInfo *this,SchemaAttDef *toAdd,bool toClone)

{
  RefVectorOf<xercesc_4_0::SchemaAttDef> *this_00;
  SchemaAttDef *this_01;
  SchemaAttDef *pSVar1;
  SchemaAttDef *clonedAttDef;
  bool toClone_local;
  SchemaAttDef *toAdd_local;
  XercesAttGroupInfo *this_local;
  
  if (this->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    this_00 = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    RefVectorOf<xercesc_4_0::SchemaAttDef>::RefVectorOf(this_00,2,true,this->fMemoryManager);
    this->fAnyAttributes = this_00;
  }
  if (toClone) {
    this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fMemoryManager);
    SchemaAttDef::SchemaAttDef(this_01,toAdd);
    pSVar1 = SchemaAttDef::getBaseAttDecl(this_01);
    if (pSVar1 == (SchemaAttDef *)0x0) {
      SchemaAttDef::setBaseAttDecl(this_01,toAdd);
    }
    BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::addElement
              (&this->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,this_01);
  }
  else {
    BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::addElement
              (&this->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,toAdd);
  }
  return;
}

Assistant:

inline void XercesAttGroupInfo::addAnyAttDef(SchemaAttDef* const toAdd,
                                             const bool toClone) {

    if (!fAnyAttributes) {
        fAnyAttributes = new (fMemoryManager) RefVectorOf<SchemaAttDef>(2, true, fMemoryManager);
    }

    if (toClone) {
        SchemaAttDef* clonedAttDef = new (fMemoryManager) SchemaAttDef(toAdd);

        if (!clonedAttDef->getBaseAttDecl())
            clonedAttDef->setBaseAttDecl(toAdd);

        fAnyAttributes->addElement(clonedAttDef);
    }
    else {
        fAnyAttributes->addElement(toAdd);
    }
}